

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnSegment::ColumnSegment
          (ColumnSegment *this,DatabaseInstance *db,shared_ptr<duckdb::BlockHandle,_true> *block_p,
          LogicalType *type,ColumnSegmentType segment_type,idx_t start,idx_t count,
          CompressionFunction *function_p,BaseStatistics *statistics,block_id_t block_id_p,
          idx_t offset,idx_t segment_size_p,
          unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
          *segment_state_p)

{
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> _Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  idx_t iVar5;
  undefined1 local_a0 [112];
  
  (this->super_SegmentBase<duckdb::ColumnSegment>).start = start;
  (this->super_SegmentBase<duckdb::ColumnSegment>).count.super___atomic_base<unsigned_long>._M_i =
       count;
  (this->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p = (__pointer_type)0x0;
  this->db = db;
  local_a0._16_8_ = &this->type;
  LogicalType::LogicalType((LogicalType *)local_a0._16_8_,type);
  iVar5 = GetTypeIdSize(type->physical_type_);
  this->type_size = iVar5;
  this->segment_type = segment_type;
  BaseStatistics::BaseStatistics((BaseStatistics *)(local_a0 + 0x18),statistics);
  local_a0._8_8_ = &this->stats;
  SegmentStatistics::SegmentStatistics(&this->stats,(BaseStatistics *)(local_a0 + 0x18));
  BaseStatistics::~BaseStatistics((BaseStatistics *)(local_a0 + 0x18));
  (this->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (block_p->internal).super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (block_p->internal).super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (block_p->internal).super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar2;
  (this->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  (block_p->internal).super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->function)._M_data = function_p;
  this->block_id = block_id_p;
  this->offset = offset;
  this->segment_size = segment_size_p;
  (this->segment_state).
  super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
  .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl =
       (CompressedSegmentState *)0x0;
  if (function_p->init_segment != (compression_init_segment_t)0x0) {
    (*function_p->init_segment)
              ((ColumnSegment *)local_a0,(block_id_t)this,
               (optional_ptr<duckdb::ColumnSegmentState,_true>)block_id_p);
    uVar4 = local_a0._0_8_;
    local_a0._0_8_ = (long *)0x0;
    _Var1._M_head_impl =
         (this->segment_state).
         super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
         .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
    (this->segment_state).
    super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
    .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl =
         (CompressedSegmentState *)uVar4;
    if (_Var1._M_head_impl != (CompressedSegmentState *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_CompressedSegmentState[1])();
      if ((long *)local_a0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_a0._0_8_ + 8))();
      }
    }
  }
  return;
}

Assistant:

ColumnSegment::ColumnSegment(DatabaseInstance &db, shared_ptr<BlockHandle> block_p, const LogicalType &type,
                             const ColumnSegmentType segment_type, const idx_t start, const idx_t count,
                             CompressionFunction &function_p, BaseStatistics statistics, const block_id_t block_id_p,
                             const idx_t offset, const idx_t segment_size_p,
                             const unique_ptr<ColumnSegmentState> segment_state_p)

    : SegmentBase<ColumnSegment>(start, count), db(db), type(type), type_size(GetTypeIdSize(type.InternalType())),
      segment_type(segment_type), stats(std::move(statistics)), block(std::move(block_p)), function(function_p),
      block_id(block_id_p), offset(offset), segment_size(segment_size_p) {

	if (function.get().init_segment) {
		segment_state = function.get().init_segment(*this, block_id, segment_state_p.get());
	}

	// For constant segments (CompressionType::COMPRESSION_CONSTANT) the block is a nullptr.
	D_ASSERT(!block || segment_size <= GetBlockManager().GetBlockSize());
}